

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O2

ClassStmt * new_class_stmt(Token *name,List *extends,BlockStmt *block,Modifier *modifier)

{
  Token *pTVar1;
  void *any;
  ClassStmt *pCVar2;
  TreeNode *pTVar3;
  
  any = malloc(0x28);
  pCVar2 = (ClassStmt *)require_not_null(any,"Failed to allocate space");
  pTVar3 = new_tree_node(name,class_eval);
  pTVar1 = pTVar3->token;
  (pCVar2->node).eval = pTVar3->eval;
  (pCVar2->node).token = pTVar1;
  pCVar2->extends = extends;
  pCVar2->block = block;
  pCVar2->modifier = modifier;
  return pCVar2;
}

Assistant:

ClassStmt *new_class_stmt(Token *name, List *extends, BlockStmt *block, Modifier* modifier) {
    ClassStmt *stmt = new(ClassStmt);
    stmt->node = tree_node_(name, eval_handler(class_eval));
    stmt->extends = extends;
    stmt->block = block;
    stmt->modifier = modifier;
    return stmt;
}